

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DelaySyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DelaySyntax,slang::syntax::DelaySyntax_const&>
          (BumpAllocator *this,DelaySyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  DelaySyntax *pDVar10;
  
  pDVar10 = (DelaySyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_TimingControlSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_TimingControlSyntax).super_SyntaxNode.previewNode;
  TVar6 = (args->hash).kind;
  uVar7 = (args->hash).field_0x2;
  NVar8.raw = (args->hash).numFlags.raw;
  uVar9 = (args->hash).rawLen;
  pIVar3 = (args->hash).info;
  pEVar4 = (args->delayValue).ptr;
  (pDVar10->super_TimingControlSyntax).super_SyntaxNode.kind =
       (args->super_TimingControlSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar10->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pDVar10->super_TimingControlSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar10->super_TimingControlSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar10->hash).kind = TVar6;
  (pDVar10->hash).field_0x2 = uVar7;
  (pDVar10->hash).numFlags = (NumericTokenFlags)NVar8.raw;
  (pDVar10->hash).rawLen = uVar9;
  (pDVar10->hash).info = pIVar3;
  (pDVar10->delayValue).ptr = pEVar4;
  return pDVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }